

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic-ops.h
# Opt level: O0

int cmpxchgi(int *ptr,int oldval,int newval)

{
  int iVar1;
  int out;
  int newval_local;
  int oldval_local;
  int *ptr_local;
  
  LOCK();
  iVar1 = *ptr;
  if (oldval == iVar1) {
    *ptr = newval;
    iVar1 = oldval;
  }
  UNLOCK();
  return iVar1;
}

Assistant:

UV_UNUSED(static int cmpxchgi(int* ptr, int oldval, int newval)) {
#if defined(__i386__) || defined(__x86_64__)
  int out;
  __asm__ __volatile__ ("lock; cmpxchg %2, %1;"
                        : "=a" (out), "+m" (*(volatile int*) ptr)
                        : "r" (newval), "0" (oldval)
                        : "memory");
  return out;
#elif defined(_AIX) && defined(__ibmxl__)
  /* FIXME: This is not actually atomic but XLClang 16.1 for AIX
     does not provide __sync_val_compare_and_swap or an equivalent.
     Its documentation suggests using C++11 atomics but this is C.  */
  __compare_and_swap((volatile int*)ptr, &oldval, newval);
  return oldval;
#elif defined(__MVS__)
  /* Use hand-rolled assembly because codegen from builtin __plo_CSST results in
   * a runtime bug.
   */
  __asm(" cs %0,%2,%1 \n " : "+r"(oldval), "+m"(*ptr) : "r"(newval) :);
  return oldval;
#elif defined(__SUNPRO_C) || defined(__SUNPRO_CC)
  return atomic_cas_uint((uint_t *)ptr, (uint_t)oldval, (uint_t)newval);
#else
  return __sync_val_compare_and_swap(ptr, oldval, newval);
#endif
}